

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

int Ivy_FastMapNodeFaninCompact2(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,int nLimit,Vec_Ptr_t *vFront)

{
  Ivy_Obj_t *pObj_00;
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = vFront->nSize;
  if (iVar1 < 1) {
    return 0;
  }
  lVar3 = 0;
  do {
    pObj_00 = (Ivy_Obj_t *)vFront->pArray[lVar3];
    uVar2 = *(uint *)&pObj_00->field_0x8 & 0xf;
    if ((uVar2 != 1) && (uVar2 != 4)) {
      iVar1 = Ivy_FastMapNodeFaninCost(pAig,pObj_00);
      if (iVar1 < 1) {
        Ivy_FastMapNodeFaninUpdate(pAig,pObj_00,vFront);
        return 1;
      }
      iVar1 = vFront->nSize;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 < iVar1);
  return 0;
}

Assistant:

int Ivy_FastMapNodeFaninCompact2( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, int nLimit, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pFanin;
    int i;
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pFanin, i )
    {
        if ( Ivy_ObjIsCi(pFanin) )
            continue;
        if ( Ivy_FastMapNodeFaninCost(pAig, pFanin) <= 0 )
        {
            Ivy_FastMapNodeFaninUpdate( pAig, pFanin, vFront );
            return 1;
        }
    }
    return 0;
}